

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O1

void __thiscall om::concurrency::thread_pool::thread_pool(thread_pool *this,uint thread_count_)

{
  thread_pool *local_48;
  code *local_40;
  undefined8 local_38;
  
  (this->_done)._M_base._M_i = false;
  (this->_task_queue)._mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_task_queue)._mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_task_queue)._mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->_task_queue)._mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_task_queue)._mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->_task_queue)._queue.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->_task_queue)._queue.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->_task_queue)._queue.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->_task_queue)._queue.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->_task_queue)._queue.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->_task_queue)._queue.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->_task_queue)._queue.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->_task_queue)._queue.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->_task_queue)._queue.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->_task_queue)._queue.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map((_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *
                    )&(this->_task_queue)._queue,0);
  std::condition_variable::condition_variable(&(this->_task_queue)._condition);
  (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_joiner)._threads = &this->_threads;
  if (thread_count_ != 0) {
    do {
      local_40 = _worker_thread;
      local_38 = 0;
      local_48 = this;
      std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<void(om::concurrency::thread_pool::*)(),om::concurrency::thread_pool*>
                ((vector<std::thread,std::allocator<std::thread>> *)&this->_threads,
                 (offset_in_thread_pool_to_subr *)&local_40,&local_48);
      thread_count_ = thread_count_ - 1;
    } while (thread_count_ != 0);
  }
  return;
}

Assistant:

explicit thread_pool(unsigned thread_count_ = std::thread::hardware_concurrency())
				: _done(false), _joiner(_threads)
			{
				try {
					for (unsigned i = 0; i < thread_count_; i++)
						_threads.emplace_back(&thread_pool::_worker_thread, this);
				} catch(...) {
					_done = true;
					throw;
				}
			}